

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_bind_replace.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
BindReplaceDemoFun2::BindReplace(ClientContext *context,TableFunctionBindInput *input)

{
  pointer pTVar1;
  char (*in_RDX) [6];
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> in_RDI;
  templated_unique_single_t tf_ref;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  int64_t value;
  templated_unique_single_t result;
  unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
  *in_stack_ffffffffffffff18;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffff20;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *this;
  Value local_a0 [40];
  Value *in_stack_ffffffffffffff88;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_58;
  undefined4 local_38;
  long local_28;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_ffffffffffffffe0;
  
  duckdb::make_uniq<BindReplaceDemoFun2::CustomFunctionData>();
  duckdb::vector<duckdb::Value,_true>::operator[]
            (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  local_28 = duckdb::Value::GetValue<long>();
  if (local_28 < 0) {
    duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
    unique_ptr<std::default_delete<duckdb::TableRef>,void>
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_38 = 1;
  }
  else {
    duckdb::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)0x749041);
    duckdb::Value::Value(local_a0,local_28);
    duckdb::make_uniq<duckdb::ConstantExpression,duckdb::Value>(in_stack_ffffffffffffff88);
    this = &local_58;
    duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>
    ::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)this,in_stack_ffffffffffffff18);
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back(this,(value_type *)in_stack_ffffffffffffff18);
    duckdb::
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x7490a4);
    duckdb::
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x7490b1);
    duckdb::Value::~Value(local_a0);
    duckdb::make_uniq<duckdb::TableFunctionRef>();
    duckdb::
    make_uniq<duckdb::FunctionExpression,char_const(&)[6],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              (in_RDX,in_stack_ffffffffffffffe0);
    duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>
    ::
    unique_ptr<duckdb::FunctionExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)this,(unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                        *)in_stack_ffffffffffffff18);
    pTVar1 = duckdb::
             unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)this);
    duckdb::
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)pTVar1);
    duckdb::
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x74911d);
    duckdb::
    unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                 *)0x749127);
    duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
    unique_ptr<duckdb::TableFunctionRef,std::default_delete<std::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>>>,void>
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)this,
               (unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>_>
                *)pTVar1);
    local_38 = 1;
    duckdb::
    unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>::
    ~unique_ptr((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                 *)0x74914b);
    duckdb::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)0x749158);
  }
  duckdb::
  unique_ptr<BindReplaceDemoFun2::CustomFunctionData,_std::default_delete<BindReplaceDemoFun2::CustomFunctionData>,_true>
  ::~unique_ptr((unique_ptr<BindReplaceDemoFun2::CustomFunctionData,_std::default_delete<BindReplaceDemoFun2::CustomFunctionData>,_true>
                 *)0x74922a);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
         ._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

static duckdb::unique_ptr<TableRef> BindReplace(ClientContext &context, TableFunctionBindInput &input) {
		auto result = make_uniq<BindReplaceDemoFun2::CustomFunctionData>();

		auto value = input.inputs[0].GetValue<int64_t>();
		if (value < 0) {
			// Note: we are returning a nullptr in a table function without bind, this will fail
			return nullptr;
		}

		duckdb::vector<duckdb::unique_ptr<ParsedExpression>> children;
		children.push_back(make_uniq<ConstantExpression>(Value(value)));
		auto tf_ref = make_uniq<TableFunctionRef>();
		tf_ref->function = make_uniq<FunctionExpression>("range", std::move(children));

		return std::move(tf_ref);
	}